

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::ApertureILS::getShuffledIntensityNeighbors
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  int iVar1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  ulong uVar2;
  uint aperture;
  long lVar3;
  double dVar4;
  _List_node_base *local_60;
  pair<int,_int> local_58;
  double local_50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&stations,__x);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  for (uVar2 = 0;
      uVar2 < stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
              _M_node._M_size; uVar2 = uVar2 + 1) {
    lVar3 = 0;
    while (lVar3 < ((Station *)local_60[1]._M_next)->max_apertures) {
      aperture = (uint)lVar3;
      dVar4 = Station::getApertureIntensity((Station *)local_60[1]._M_next,aperture);
      if (0.0 < dVar4) {
        local_58 = (pair<int,_int>)((ulong)~aperture << 0x20 | uVar2);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,&local_58);
      }
      local_50 = Station::getApertureIntensity((Station *)local_60[1]._M_next,aperture);
      iVar1 = Station::getMaxIntensity((Station *)local_60[1]._M_next);
      if (local_50 <= (double)iVar1) {
        lVar3 = lVar3 + 1;
        local_58 = (pair<int,_int>)(lVar3 << 0x20 | uVar2);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,&local_58);
      }
      else {
        lVar3 = lVar3 + 1;
      }
    }
    std::__advance<std::_List_iterator<imrt::Station*>,long>(&local_60,1);
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            ((__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish);
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  return __return_storage_ptr__;
}

Assistant:

vector < pair<int, int> > ApertureILS::getShuffledIntensityNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair<int, int>> a_list;
  list<Station*>::iterator s;
  s = stations.begin();
  for (int i = 0; i < stations.size(); i++) {
    for (int j = 0; j < (*s)->getNbApertures();j++){
      //One pair -j (-aperture) for reducing intensity
      //One pair for increasing intensity (+j)
      if ((*s)->getApertureIntensity(j) > 0)
        a_list.push_back(make_pair(i,-(j+1)));
      
      if ((*s)->getApertureIntensity(j) <= (*s)->getMaxIntensity())
        a_list.push_back(make_pair(i,(j+1)));
    }
    std::advance(s,1);
  }
  //cout << "Size neighborhood " << a_list.size()<< endl;
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}